

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O0

bool __thiscall Dinic::levels(Dinic *this)

{
  int iVar1;
  int iVar2;
  initializer_list<int> __l;
  bool bVar3;
  iterator __first;
  iterator __last;
  reference pvVar4;
  reference pvVar5;
  reference this_00;
  reference piVar6;
  reference pvVar7;
  Flow FVar8;
  vector<int,_std::allocator<int>_> *this_01;
  int local_110;
  int local_10c;
  int b;
  int x;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int a;
  allocator<int> local_dd;
  int local_dc;
  iterator local_d8;
  size_type local_d0;
  deque<int,_std::allocator<int>_> local_c8;
  undefined1 local_78 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> bfs;
  Dinic *this_local;
  
  this_01 = &this->d;
  __first = std::vector<int,_std::allocator<int>_>::begin(this_01);
  __last = std::vector<int,_std::allocator<int>_>::end(this_01);
  bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._4_4_ = 0xffffffff;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             (int *)((long)&bfs.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node + 4));
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)this->S);
  *pvVar4 = 0;
  local_dc = this->S;
  local_d8 = &local_dc;
  local_d0 = 1;
  std::allocator<int>::allocator(&local_dd);
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::deque<int,_std::allocator<int>_>::deque(&local_c8,__l,&local_dd);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78,&local_c8);
  std::deque<int,_std::allocator<int>_>::~deque(&local_c8);
  std::allocator<int>::~allocator(&local_dd);
  while (bVar3 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78);
    iVar2 = *pvVar5;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78);
    if (iVar2 == this->T) break;
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&this->g,(long)iVar2);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this_00);
    _b = std::vector<int,_std::allocator<int>_>::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&b), bVar3) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_10c = *piVar6;
      pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[](&this->e,(long)local_10c);
      local_110 = pvVar7->b;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->d,(long)local_110);
      if (*pvVar4 == -1) {
        pvVar7 = std::vector<Edge,_std::allocator<Edge>_>::operator[](&this->e,(long)local_10c);
        FVar8 = Edge::unused(pvVar7);
        if (FVar8 != 0) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->d,(long)iVar2);
          iVar1 = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->d,(long)local_110);
          *pvVar4 = iVar1 + 1;
          std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                    ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78,&local_110);
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->d,(long)this->T);
  iVar2 = *pvVar4;
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_78);
  return iVar2 != -1;
}

Assistant:

bool levels() {
        fill(d.begin(), d.end(), -1);
        d[S] = 0;
        queue<int> bfs({S});
        while (!bfs.empty()) {
            int a = bfs.front();
            bfs.pop();
            if (a == T) break;
            for (auto x : g[a]) {
                int b = e[x].b;
                if (d[b] != -1 || e[x].unused() == 0) continue;
                d[b] = d[a] + 1;
                bfs.push(b);
            }
        }
        return d[T] != -1;
    }